

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O2

string * __thiscall
miniros::TransportUDP::getTransportInfo_abi_cxx11_
          (string *__return_storage_ptr__,TransportUDP *this)

{
  ostream *poVar1;
  stringstream str;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"UDPROS connection on port ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->local_port_);
  poVar1 = std::operator<<(poVar1," to [");
  poVar1 = std::operator<<(poVar1,(string *)&this->cached_remote_host_);
  std::operator<<(poVar1,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string TransportUDP::getTransportInfo()
{
  std::stringstream str;
  str << "UDPROS connection on port " << local_port_ << " to [" << cached_remote_host_ << "]";
  return str.str();
}